

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_transaction.cpp
# Opt level: O0

void __thiscall
duckdb::MetaTransaction::RemoveTransaction(MetaTransaction *this,AttachedDatabase *db)

{
  bool bVar1;
  InternalException *this_00;
  size_type sVar2;
  reference this_01;
  AttachedDatabase *a;
  AttachedDatabase *in_RSI;
  long in_RDI;
  value_type *db_entry;
  idx_t i;
  iterator entry;
  AttachedDatabase *in_stack_ffffffffffffff58;
  ulong __n;
  unordered_map<std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>_>
  *in_stack_ffffffffffffff60;
  _Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_true>
  in_stack_ffffffffffffff68;
  allocator *paVar3;
  ulong local_78;
  allocator local_49;
  idx_t in_stack_ffffffffffffffb8;
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_true>
  local_28 [2];
  _Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_true>
  local_18;
  AttachedDatabase *local_10;
  
  local_10 = in_RSI;
  ::std::reference_wrapper<duckdb::AttachedDatabase>::
  reference_wrapper<duckdb::AttachedDatabase&,void,duckdb::AttachedDatabase*>
            ((reference_wrapper<duckdb::AttachedDatabase> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  local_18._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>_>
       ::find((unordered_map<std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>_>
               *)in_stack_ffffffffffffff58,(key_type *)0xcbe446);
  local_28[0]._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>_>
       ::end((unordered_map<std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>_>
              *)in_stack_ffffffffffffff58);
  bVar1 = ::std::__detail::operator==(&local_18,local_28);
  if (bVar1) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    paVar3 = &local_49;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb8,
               "MetaTransaction::RemoveTransaction called but meta transaction did not have a transaction for this database"
               ,paVar3);
    InternalException::InternalException(this_00,(string *)in_stack_ffffffffffffff58);
    __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
  }
  ::std::
  unordered_map<std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>_>
  ::erase(in_stack_ffffffffffffff60,(iterator)in_stack_ffffffffffffff68._M_cur);
  local_78 = 0;
  while( true ) {
    __n = local_78;
    sVar2 = ::std::
            vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
            ::size((vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                    *)(in_RDI + 0xd0));
    if (sVar2 <= __n) {
      return;
    }
    this_01 = vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true>::operator[]
                        ((vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *)
                         in_stack_ffffffffffffff60,__n);
    a = ::std::reference_wrapper<duckdb::AttachedDatabase>::get(this_01);
    bVar1 = RefersToSameObject<duckdb::AttachedDatabase>(a,local_10);
    if (bVar1) break;
    local_78 = local_78 + 1;
  }
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true>::erase_at
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void MetaTransaction::RemoveTransaction(AttachedDatabase &db) {
	auto entry = transactions.find(db);
	if (entry == transactions.end()) {
		throw InternalException("MetaTransaction::RemoveTransaction called but meta transaction did not have a "
		                        "transaction for this database");
	}
	transactions.erase(entry);
	for (idx_t i = 0; i < all_transactions.size(); i++) {
		auto &db_entry = all_transactions[i];
		if (RefersToSameObject(db_entry.get(), db)) {
			all_transactions.erase_at(i);
			break;
		}
	}
}